

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libmeshb7.c
# Opt level: O2

void GmfSetFloatPrecision(int64_t MshIdx,int FltSiz)

{
  if ((FltSiz != 0x40) && (FltSiz != 0x20)) {
    return;
  }
  *(int *)(MshIdx + 0x18) = FltSiz;
  GmfSetKwd(MshIdx,0x9b,1);
  GmfSetLin(MshIdx,0x9b,FltSiz);
  return;
}

Assistant:

void GmfSetFloatPrecision(int64_t MshIdx , int FltSiz)
{
   GmfMshSct *msh = (GmfMshSct *)MshIdx;

   if(FltSiz != 32 && FltSiz != 64)
      return;

   msh->FltSiz = FltSiz;
   GmfSetKwd(MshIdx, GmfFloatingPointPrecision, 1);
   GmfSetLin(MshIdx, GmfFloatingPointPrecision, FltSiz);
}